

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O2

void __thiscall QPicture::setData(QPicture *this,char *data,uint size)

{
  QPicturePrivate *pQVar1;
  
  QExplicitlySharedDataPointer<QPicturePrivate>::detach(&this->d_ptr);
  QBuffer::setData((char *)&((this->d_ptr).d.ptr)->pictb,(longlong)data);
  pQVar1 = (this->d_ptr).d.ptr;
  pQVar1->formatOk = false;
  pQVar1->formatMajor = 0x17;
  pQVar1->formatMinor = 0;
  return;
}

Assistant:

void QPicture::setData(const char* data, uint size)
{
    detach();
    d_func()->pictb.setData(data, size);
    d_func()->resetFormat();                                // we'll have to check
}